

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

int __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Hdr *pHVar1;
  bool bVar2;
  int iVar3;
  Ptr<void> shadow;
  
  if (src == (EVP_PKEY_CTX *)0x0) {
    clear(this);
    iVar3 = 0;
  }
  else {
    shadow.m_p = (void *)0x0;
    shadow.m_refCount = (RefCount *)0x0;
    pHVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr;
    if (((pHVar1 == (Hdr *)0x0) || (dst < pHVar1 + 1)) ||
       ((EVP_PKEY_CTX *)((long)&pHVar1[1].super_RefCount._vptr_RefCount + pHVar1->m_bufferSize) <=
        dst)) {
      bVar2 = setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(this,(size_t)src);
      if (bVar2) {
        memmove((this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p,dst,(size_t)src);
      }
      else {
        src = (EVP_PKEY_CTX *)0xffffffffffffffff;
      }
    }
    else {
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p = (char *)dst;
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count = (size_t)src;
    }
    iVar3 = (int)src;
    rc::Ptr<void>::~Ptr(&shadow);
  }
  return iVar3;
}

Assistant:

size_t
	copy(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			if (Details::IsSimple) {
				// for simple non-ctor-dtor types we can apply in-buffer shift

				T* end = (T*)this->m_hdr->getEnd();
				ASSERT(p + count <= end);

				this->m_p = (T*)p;
				this->m_count = count;
				return count;
			} else {
				shadow = this->m_hdr; // ensure we keep p intact
			}

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copy(this->m_p, p, count);
		return count;
	}